

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeYMD(DateTime *p)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  long lStack_8;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    p->Y = 2000;
    p->M = 1;
    iVar3 = 1;
    lStack_8 = 0x10;
  }
  else {
    if (0x1a6401072fdff < (ulong)p->iJD) {
      p->s = 0.0;
      p->validJD = '\0';
      p->rawS = '\0';
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->validTZ = '\0';
      p->tzSet = '\0';
      p->isError = '\0';
      p->field_0x2f = 0;
      p->D = 0;
      p->h = 0;
      p->m = 0;
      p->tz = 0;
      p->iJD = 0;
      p->Y = 0;
      p->M = 0;
      pcVar6 = &p->isError;
      goto LAB_001af3dd;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = p->iJD + 43200000;
    iVar3 = SUB164(auVar1 / ZEXT816(86400000),0);
    iVar5 = (int)(((double)iVar3 + -1867216.25) / 36524.25);
    iVar5 = iVar5 / -4 + iVar3 + iVar5 + 0x5f5;
    uVar4 = (uint)(((double)iVar5 + -122.1) / 365.25);
    iVar5 = iVar5 - ((uVar4 & 0x7fff) * 0x8ead) / 100;
    dVar2 = (double)iVar5 / 30.6001;
    iVar3 = (int)dVar2;
    p->D = iVar5 - (int)((double)(int)dVar2 * 30.6001);
    iVar3 = (-(uint)(iVar3 < 0xe) | 0xfffffff3) + iVar3;
    p->M = iVar3;
    iVar3 = (2 < iVar3 ^ 0xffffed95) + uVar4;
    lStack_8 = 8;
  }
  *(int *)((long)&p->iJD + lStack_8) = iVar3;
  pcVar6 = &p->validYMD;
LAB_001af3dd:
  *pcVar6 = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else if( !validJulianDay(p->iJD) ){
    datetimeError(p);
    return;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*(C&32767))/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}